

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validators_inl.hpp
# Opt level: O0

void __thiscall
CLI::Validator::_merge_description(Validator *this,Validator *val1,Validator *val2,string *merger)

{
  anon_class_96_3_da09e219 local_98;
  Validator *local_38;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  *dfunc2;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  *dfunc1;
  string *merger_local;
  Validator *val2_local;
  Validator *val1_local;
  Validator *this_local;
  
  local_38 = val2;
  dfunc2 = &val1->desc_function_;
  dfunc1 = (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
            *)merger;
  merger_local = (string *)val2;
  val2_local = val1;
  val1_local = this;
  _GLOBAL__N_1::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>::
  function(&local_98.dfunc1,&val1->desc_function_);
  _GLOBAL__N_1::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>::
  function(&local_98.dfunc2,&local_38->desc_function_);
  std::__cxx11::string::string((string *)&local_98.merger,(string *)dfunc1);
  std::function<std::__cxx11::string()>::operator=
            ((function<std::__cxx11::string()> *)this,&local_98);
  _merge_description(CLI::Validator_const&,CLI::Validator_const&,std::__cxx11::string_const&)::
  {lambda()#1}::~basic_string((_lambda___1_ *)&local_98);
  return;
}

Assistant:

CLI11_INLINE void
Validator::_merge_description(const Validator &val1, const Validator &val2, const std::string &merger) {

    const std::function<std::string()> &dfunc1 = val1.desc_function_;
    const std::function<std::string()> &dfunc2 = val2.desc_function_;

    desc_function_ = [=]() {
        std::string f1 = dfunc1();
        std::string f2 = dfunc2();
        if((f1.empty()) || (f2.empty())) {
            return f1 + f2;
        }
        return std::string(1, '(') + f1 + ')' + merger + '(' + f2 + ')';
    };
}